

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QStorageInfo>::reallocateAndGrow
          (QArrayDataPointer<QStorageInfo> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QStorageInfo> *old)

{
  long lVar1;
  bool bVar2;
  QStorageInfo *pQVar3;
  QGenericArrayOps<QStorageInfo> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QStorageInfo> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QStorageInfo> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<QStorageInfo> *in_stack_ffffffffffffff70;
  QArrayDataPointer<QStorageInfo> *in_stack_ffffffffffffff78;
  QGenericArrayOps<QStorageInfo> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QStorageInfo> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QStorageInfo> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pQVar3 = data((QArrayDataPointer<QStorageInfo> *)&stack0xffffffffffffffe0),
       pQVar3 == (QStorageInfo *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_007ebabe;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QStorageInfo> *)
                  operator->((QArrayDataPointer<QStorageInfo> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QStorageInfo> *)0x7eb9d7);
        begin((QArrayDataPointer<QStorageInfo> *)0x7eb9e6);
        QtPrivate::QGenericArrayOps<QStorageInfo>::copyAppend
                  (this_00,(QStorageInfo *)in_stack_ffffffffffffff78,
                   (QStorageInfo *)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<QStorageInfo> *)
             operator->((QArrayDataPointer<QStorageInfo> *)&stack0xffffffffffffffe0);
        pQVar3 = begin((QArrayDataPointer<QStorageInfo> *)0x7eba1b);
        begin((QArrayDataPointer<QStorageInfo> *)0x7eba2a);
        QtPrivate::QGenericArrayOps<QStorageInfo>::moveAppend
                  (in_stack_ffffffffffffff80,pQVar3,(QStorageInfo *)in_stack_ffffffffffffff70);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<QStorageInfo> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<QStorageInfo> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<QStorageInfo>::reallocate
              ((QMovableArrayOps<QStorageInfo> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_007ebabe:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }